

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawShader::Parse(CommandDrawShader *this,FScanner *sc,bool fullScreenOffsets)

{
  uint uVar1;
  bool bVar2;
  
  FScanner::MustGetToken(sc,0x104);
  uVar1 = sc->Number;
  this->width = uVar1;
  if ((int)uVar1 < 1) {
    FScanner::ScriptError(sc,"Width must be greater than 1.");
  }
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  uVar1 = sc->Number;
  this->height = uVar1;
  if ((int)uVar1 < 1) {
    FScanner::ScriptError(sc,"Height must be greater than 1.");
  }
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar2 = FScanner::Compare(sc,"vertical");
  if (bVar2) {
    this->vertical = true;
  }
  else {
    bVar2 = FScanner::Compare(sc,"horizontal");
    if (!bVar2) {
      FScanner::ScriptError(sc,"Unknown direction \'%s\'.",sc->String);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  bVar2 = FScanner::CheckToken(sc,0x101);
  if (bVar2) {
    bVar2 = FScanner::Compare(sc,"reverse");
    if (!bVar2) {
      FScanner::ScriptError(sc,"Exspected \'reverse\', got \'%s\' instead.",sc->String);
    }
    this->reverse = true;
    FScanner::MustGetToken(sc,0x2c);
  }
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  FScanner::MustGetToken(sc,0x3b);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_IntConst);
			width = sc.Number;
			if(sc.Number < 1)
				sc.ScriptError("Width must be greater than 1.");
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			height = sc.Number;
			if(sc.Number < 1)
				sc.ScriptError("Height must be greater than 1.");
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("vertical"))
				vertical = true;
			else if(!sc.Compare("horizontal"))
				sc.ScriptError("Unknown direction '%s'.", sc.String);
			sc.MustGetToken(',');
			if(sc.CheckToken(TK_Identifier))
			{
				if(!sc.Compare("reverse"))
				{
					sc.ScriptError("Exspected 'reverse', got '%s' instead.", sc.String);
				}
				reverse = true;
				sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, x, y);
			sc.MustGetToken(';');
		}